

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O3

void __thiscall senjo::UCIAdapter::UCIAdapter(UCIAdapter *this)

{
  this->_vptr_UCIAdapter = (_func_int **)&PTR__UCIAdapter_0015bad8;
  this->engine = (ChessEngine *)0x0;
  Thread::Thread(&this->thread);
  (this->lastPosition)._M_dataplus._M_p = (pointer)&(this->lastPosition).field_2;
  (this->lastPosition)._M_string_length = 0;
  (this->lastPosition).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

UCIAdapter::UCIAdapter()
  : engine(NULL)
{
}